

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aistr.cpp
# Opt level: O2

size_t ai::length(char *str,size_t max_length)

{
  size_t sVar1;
  
  checkPointerNotNull(str);
  sVar1 = strnlen(str,max_length);
  return sVar1;
}

Assistant:

std::size_t length(const char* str, const size_t max_length)
    {
        checkPointerNotNull(str);
#ifdef _MSC_VER
        return strnlen_s(str, max_length);
#else
        return strnlen(str, max_length);
#endif
    }